

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quatd *value)

{
  bool bVar1;
  double4 v;
  array<double,_4UL> local_28;
  
  bVar1 = ParseBasicTypeTuple<double,4ul>(this,&local_28);
  if (bVar1) {
    value->real = local_28._M_elems[0];
    (value->imag)._M_elems[0] = local_28._M_elems[1];
    (value->imag)._M_elems[1] = local_28._M_elems[2];
    (value->imag)._M_elems[2] = local_28._M_elems[3];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quatd *value) {
  value::double4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}